

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O2

void __thiscall
cmGeneratorExpressionEvaluationFile::Generate
          (cmGeneratorExpressionEvaluationFile *this,cmLocalGenerator *lg,string *config,
          string *lang,cmCompiledGeneratorExpression *inputExpression,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *outputFiles,mode_t perm)

{
  size_type sVar1;
  bool bVar2;
  __type _Var3;
  cmGeneratorTarget *headTarget;
  string *psVar4;
  ostream *poVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  bool hasNewLine;
  string outputFileName;
  string rawCondition;
  string line;
  istringstream iss;
  cmGeneratedFileStream fout;
  
  std::__cxx11::string::string
            ((string *)&rawCondition,
             (string *)
             &((this->Condition)._M_t.
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->Input);
  headTarget = cmLocalGenerator::FindGeneratorTargetToUse(lg,&this->Target);
  if (rawCondition._M_string_length == 0) {
LAB_003daa6e:
    GetOutputFileName(&outputFileName,this,lg,headTarget,config,lang);
    psVar4 = cmCompiledGeneratorExpression::Evaluate
                       (inputExpression,lg,config,headTarget,(cmGeneratorExpressionDAGChecker *)0x0,
                        (cmGeneratorTarget *)0x0,lang);
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&outputFiles->_M_t,&outputFileName);
    if ((_Rb_tree_header *)iVar6._M_node == &(outputFiles->_M_t)._M_impl.super__Rb_tree_header) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&lg->Makefile->OutputFiles,&outputFileName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->Files,&outputFileName);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](outputFiles,&outputFileName);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      sVar1 = (this->NewLineCharacter)._M_string_length;
      cmGeneratedFileStream::cmGeneratedFileStream(&fout,None);
      cmGeneratedFileStream::Open(&fout,&outputFileName,false,sVar1 != 0);
      if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
           [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                  _vptr_basic_ostream[-3]] & 5) == 0) {
        cmGeneratedFileStream::SetCopyIfDifferent(&fout,true);
        std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)psVar4,_S_in);
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length = 0;
        line.field_2._M_local_buf[0] = '\0';
        hasNewLine = false;
        while( true ) {
          bVar2 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)&iss,&line,&hasNewLine,0xffffffffffffffff);
          if (!bVar2) break;
          std::operator<<((ostream *)&fout,(string *)&line);
          if ((this->NewLineCharacter)._M_string_length == 0) {
            if (hasNewLine == true) {
              std::operator<<((ostream *)&fout,"\n");
            }
          }
          else {
            std::operator<<((ostream *)&fout,(string *)&this->NewLineCharacter);
          }
        }
        bVar2 = cmGeneratedFileStream::Close(&fout);
        if (bVar2 && perm != 0) {
          cmsys::SystemTools::SetPermissions(outputFileName._M_dataplus._M_p,perm,false);
        }
        std::__cxx11::string::~string((string *)&line);
        std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iss,
                       "Could not open file for write in copy operation ",&outputFileName);
        cmLocalGenerator::IssueMessage(lg,FATAL_ERROR,(string *)&iss);
        std::__cxx11::string::~string((string *)&iss);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
    }
    else {
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (iVar6._M_node + 2),psVar4);
      if (!_Var3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fout);
        poVar5 = std::operator<<((ostream *)&fout,
                                 "Evaluation file to be written multiple times with different content. This is generally caused by the content evaluating the configuration type, language, or location of object files:\n "
                                );
        std::operator<<(poVar5,(string *)&outputFileName);
        std::__cxx11::stringbuf::str();
        cmLocalGenerator::IssueMessage(lg,FATAL_ERROR,(string *)&iss);
        std::__cxx11::string::~string((string *)&iss);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fout);
      }
    }
    psVar4 = &outputFileName;
  }
  else {
    psVar4 = cmCompiledGeneratorExpression::Evaluate
                       ((this->Condition)._M_t.
                        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                        .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                        lg,config,headTarget,(cmGeneratorExpressionDAGChecker *)0x0,
                        (cmGeneratorTarget *)0x0,lang);
    std::__cxx11::string::string((string *)&iss,(string *)psVar4);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &iss,"0");
    if (!bVar2) {
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &iss,"1");
      if (!bVar2) {
        std::__cxx11::string::~string((string *)&iss);
        goto LAB_003daa6e;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fout);
      poVar5 = std::operator<<((ostream *)&fout,"Evaluation file condition \"");
      poVar5 = std::operator<<(poVar5,(string *)&rawCondition);
      poVar5 = std::operator<<(poVar5,"\" did not evaluate to valid content. Got \"");
      poVar5 = std::operator<<(poVar5,(string *)&iss);
      std::operator<<(poVar5,"\".");
      std::__cxx11::stringbuf::str();
      cmLocalGenerator::IssueMessage(lg,FATAL_ERROR,&outputFileName);
      std::__cxx11::string::~string((string *)&outputFileName);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fout);
    }
    psVar4 = (string *)&iss;
  }
  std::__cxx11::string::~string((string *)psVar4);
  std::__cxx11::string::~string((string *)&rawCondition);
  return;
}

Assistant:

void cmGeneratorExpressionEvaluationFile::Generate(
  cmLocalGenerator* lg, const std::string& config, const std::string& lang,
  cmCompiledGeneratorExpression* inputExpression,
  std::map<std::string, std::string>& outputFiles, mode_t perm)
{
  std::string rawCondition = this->Condition->GetInput();
  cmGeneratorTarget* target = lg->FindGeneratorTargetToUse(this->Target);
  if (!rawCondition.empty()) {
    std::string condResult =
      this->Condition->Evaluate(lg, config, target, nullptr, nullptr, lang);
    if (condResult == "0") {
      return;
    }
    if (condResult != "1") {
      std::ostringstream e;
      e << "Evaluation file condition \"" << rawCondition
        << "\" did "
           "not evaluate to valid content. Got \""
        << condResult << "\".";
      lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
  }

  const std::string outputFileName =
    this->GetOutputFileName(lg, target, config, lang);
  const std::string& outputContent =
    inputExpression->Evaluate(lg, config, target, nullptr, nullptr, lang);

  auto it = outputFiles.find(outputFileName);

  if (it != outputFiles.end()) {
    if (it->second == outputContent) {
      return;
    }
    std::ostringstream e;
    e << "Evaluation file to be written multiple times with different "
         "content. "
         "This is generally caused by the content evaluating the "
         "configuration type, language, or location of object files:\n "
      << outputFileName;
    lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  lg->GetMakefile()->AddCMakeOutputFile(outputFileName);
  this->Files.push_back(outputFileName);
  outputFiles[outputFileName] = outputContent;

  bool openWithBinaryFlag = false;
  if (!this->NewLineCharacter.empty()) {
    openWithBinaryFlag = true;
  }
  cmGeneratedFileStream fout;
  fout.Open(outputFileName, false, openWithBinaryFlag);
  if (!fout) {
    lg->IssueMessage(MessageType::FATAL_ERROR,
                     "Could not open file for write in copy operation " +
                       outputFileName);
    return;
  }
  fout.SetCopyIfDifferent(true);
  std::istringstream iss(outputContent);
  std::string line;
  bool hasNewLine = false;
  while (cmSystemTools::GetLineFromStream(iss, line, &hasNewLine)) {
    fout << line;
    if (!this->NewLineCharacter.empty()) {
      fout << this->NewLineCharacter;
    } else if (hasNewLine) {
      // if new line character is not specified, the file will be opened in
      // text mode. So, "\n" will be translated to the correct newline
      // ending based on the platform.
      fout << "\n";
    }
  }
  if (fout.Close() && perm) {
    cmSystemTools::SetPermissions(outputFileName.c_str(), perm);
  }
}